

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  longlong lVar73;
  longlong lVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  int in_ECX;
  long lVar93;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  InterpFilterParams *in_stack_00000008;
  __m128i res_16b_3;
  __m128i res_clip_1;
  __m128i res_16b_2;
  __m128i round_result_hi;
  __m128i round_result_lo;
  __m128i comp_avg_res_hi;
  __m128i comp_avg_res_lo;
  __m128i data_ref_0_hi;
  __m128i data_ref_0_lo;
  __m128i data_hi;
  __m128i data_lo;
  __m128i res_unsigned_hi;
  __m128i res_hi_round;
  __m128i res_16b_1;
  __m128i res_clip;
  __m128i res_16b;
  __m128i round_result;
  __m128i comp_avg_res;
  __m128i data_ref_0;
  __m128i data_0;
  __m128i res_unsigned_lo;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i res_odd_1;
  __m128i res_7_1;
  __m128i res_5_1;
  __m128i res_3_1;
  __m128i res_1_1;
  __m128i src_7;
  __m128i src_5;
  __m128i src_3;
  __m128i src_1;
  __m128i res_even_1;
  __m128i res_6_1;
  __m128i res_4_1;
  __m128i res_2_1;
  __m128i res_0_1;
  __m128i src_6;
  __m128i src_4;
  __m128i src_2;
  __m128i src_0;
  int16_t *data_1;
  __m128i round_shift_1;
  __m128i round_const_1;
  __m128i coeff_67_1;
  __m128i coeff_45_1;
  __m128i coeff_23_1;
  __m128i coeff_01_1;
  __m128i tmp_1_1;
  __m128i tmp_0_1;
  __m128i coeffs_y;
  int16_t *y_filter;
  __m128i res;
  __m128i res_odd;
  __m128i res_7;
  __m128i res_5;
  __m128i res_3;
  __m128i res_1;
  __m128i res_even;
  __m128i res_6;
  __m128i res_4;
  __m128i res_2;
  __m128i res_0;
  __m128i data2;
  __m128i data;
  __m128i round_shift;
  __m128i round_const;
  __m128i coeff_67;
  __m128i coeff_45;
  __m128i coeff_23;
  __m128i coeff_01;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i coeffs_x;
  int16_t *x_filter;
  __m128i clip_pixel_to_bd;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  uint16_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int use_dist_wtd_comp_avg;
  int do_average;
  int j;
  int i;
  int im_stride;
  int im_h;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int16_t im_block [17792];
  undefined2 local_9b94;
  undefined8 local_9b88;
  undefined8 uStack_9b80;
  undefined8 local_9b68;
  undefined8 uStack_9b60;
  longlong local_9b38 [2];
  longlong local_9b28 [2];
  __m128i local_9b18;
  __m128i local_9b08;
  ulong local_9af8;
  undefined8 uStack_9af0;
  ulong local_9ae8;
  undefined8 uStack_9ae0;
  int local_9ad8;
  int iStack_9ad4;
  int iStack_9ad0;
  int iStack_9acc;
  int local_9ac8;
  int iStack_9ac4;
  int iStack_9ac0;
  int iStack_9abc;
  undefined1 local_9ab8 [16];
  ushort local_9aa8;
  ushort uStack_9aa6;
  ushort uStack_9aa4;
  ushort uStack_9aa2;
  ushort uStack_9aa0;
  ushort uStack_9a9e;
  ushort uStack_9a9c;
  ushort uStack_9a9a;
  undefined1 local_9a98 [16];
  longlong local_9a78 [2];
  __m128i local_9a68;
  ulong local_9a58;
  undefined8 uStack_9a50;
  int local_9a48;
  int iStack_9a44;
  int iStack_9a40;
  int iStack_9a3c;
  int local_9a38;
  int iStack_9a34;
  int iStack_9a30;
  int iStack_9a2c;
  int local_9a28;
  int iStack_9a24;
  int iStack_9a20;
  int iStack_9a1c;
  int local_9a18;
  int iStack_9a14;
  int iStack_9a10;
  int iStack_9a0c;
  int local_9a08;
  int iStack_9a04;
  int iStack_9a00;
  int iStack_99fc;
  undefined1 local_99f8 [16];
  undefined1 local_99e8 [16];
  undefined1 local_99d8 [16];
  undefined1 local_99c8 [16];
  undefined2 local_99b8;
  undefined2 uStack_99b6;
  undefined2 uStack_99b4;
  undefined2 uStack_99b2;
  undefined2 uStack_99b0;
  undefined2 uStack_99ae;
  undefined2 uStack_99ac;
  undefined2 uStack_99aa;
  undefined2 local_99a8;
  undefined2 uStack_99a6;
  undefined2 uStack_99a4;
  undefined2 uStack_99a2;
  undefined2 uStack_99a0;
  undefined2 uStack_999e;
  undefined2 uStack_999c;
  undefined2 uStack_999a;
  undefined2 local_9998;
  undefined2 uStack_9996;
  undefined2 uStack_9994;
  undefined2 uStack_9992;
  undefined2 uStack_9990;
  undefined2 uStack_998e;
  undefined2 uStack_998c;
  undefined2 uStack_998a;
  undefined2 local_9988;
  undefined2 uStack_9986;
  undefined2 uStack_9984;
  undefined2 uStack_9982;
  undefined2 uStack_9980;
  undefined2 uStack_997e;
  undefined2 uStack_997c;
  undefined2 uStack_997a;
  int local_9978;
  int iStack_9974;
  int iStack_9970;
  int iStack_996c;
  undefined1 local_9968 [16];
  undefined1 local_9958 [16];
  undefined1 local_9948 [16];
  undefined1 local_9938 [16];
  undefined2 local_9928;
  undefined2 uStack_9926;
  undefined2 uStack_9924;
  undefined2 uStack_9922;
  undefined2 uStack_9920;
  undefined2 uStack_991e;
  undefined2 uStack_991c;
  undefined2 uStack_991a;
  undefined2 local_9918;
  undefined2 uStack_9916;
  undefined2 uStack_9914;
  undefined2 uStack_9912;
  undefined2 uStack_9910;
  undefined2 uStack_990e;
  undefined2 uStack_990c;
  undefined2 uStack_990a;
  undefined2 local_9908;
  undefined2 uStack_9906;
  undefined2 uStack_9904;
  undefined2 uStack_9902;
  undefined2 uStack_9900;
  undefined2 uStack_98fe;
  undefined2 uStack_98fc;
  undefined2 uStack_98fa;
  undefined2 local_98f8;
  undefined2 uStack_98f6;
  undefined2 uStack_98f4;
  undefined2 uStack_98f2;
  undefined2 uStack_98f0;
  undefined2 uStack_98ee;
  undefined2 uStack_98ec;
  undefined2 uStack_98ea;
  undefined8 *local_98e0;
  ulong local_98d8;
  undefined8 uStack_98d0;
  undefined8 local_98c8;
  undefined8 uStack_98c0;
  undefined8 local_98b8;
  undefined8 uStack_98b0;
  undefined8 local_98a8;
  undefined8 uStack_98a0;
  undefined8 local_9898;
  undefined4 uStack_9890;
  undefined4 uStack_988c;
  undefined8 local_9888;
  undefined8 uStack_9880;
  undefined4 local_9878;
  undefined4 uStack_9874;
  undefined4 uStack_9870;
  undefined4 uStack_986c;
  undefined4 local_9868;
  undefined4 uStack_9864;
  undefined4 uStack_9860;
  undefined4 uStack_985c;
  undefined8 local_9858;
  undefined8 uStack_9850;
  int16_t *local_9840;
  undefined1 local_9838 [16];
  int local_9828;
  int iStack_9824;
  int iStack_9820;
  int iStack_981c;
  undefined1 local_9818 [16];
  undefined1 local_9808 [16];
  undefined1 local_97f8 [16];
  undefined1 local_97e8 [16];
  int local_97d8;
  int iStack_97d4;
  int iStack_97d0;
  int iStack_97cc;
  undefined1 local_97c8 [16];
  undefined1 local_97b8 [16];
  undefined1 local_97a8 [16];
  undefined1 local_9798 [16];
  undefined8 local_9788;
  undefined8 uStack_9780;
  undefined8 local_9778;
  undefined8 uStack_9770;
  ulong local_9768;
  undefined8 uStack_9760;
  undefined8 local_9758;
  undefined8 uStack_9750;
  undefined8 local_9748;
  undefined8 uStack_9740;
  undefined8 local_9738;
  undefined8 uStack_9730;
  undefined8 local_9728;
  undefined4 uStack_9720;
  undefined4 uStack_971c;
  undefined8 local_9718;
  undefined8 uStack_9710;
  undefined4 local_9708;
  undefined4 uStack_9704;
  undefined4 uStack_9700;
  undefined4 uStack_96fc;
  undefined4 local_96f8;
  undefined4 uStack_96f4;
  undefined4 uStack_96f0;
  undefined4 uStack_96ec;
  undefined8 local_96e8;
  undefined8 uStack_96e0;
  int16_t *local_96d0;
  undefined8 local_96c8;
  undefined8 uStack_96c0;
  longlong local_96b8;
  longlong lStack_96b0;
  int local_969c;
  longlong local_9698;
  longlong lStack_9690;
  int local_9680;
  int local_967c;
  longlong local_9678;
  longlong lStack_9670;
  longlong local_9668;
  longlong lStack_9660;
  undefined4 local_9658;
  undefined4 local_9654;
  long local_9650;
  int local_9644;
  int local_9640;
  int local_963c;
  int local_9638;
  int local_9634;
  int local_9630;
  int local_962c;
  int local_9628;
  int local_9624;
  long local_9620;
  undefined8 local_9618 [4449];
  int local_b0c;
  int local_b08;
  int local_b04;
  long local_b00;
  int local_af4;
  undefined1 local_ae8 [16];
  uint local_acc;
  undefined1 local_ac8 [16];
  uint local_ab8;
  int local_ab4;
  int local_ab0;
  int local_aac;
  int local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined2 local_a9a;
  int16_t *local_a98;
  undefined1 (*local_a90) [16];
  undefined1 (*local_a88) [16];
  int16_t *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  longlong local_978;
  longlong lStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_808;
  int iStack_804;
  int iStack_800;
  int iStack_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  int local_788;
  int iStack_784;
  int iStack_780;
  int iStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 *local_640;
  ulong local_638;
  undefined8 uStack_630;
  ulong *local_620;
  ulong local_618;
  undefined8 uStack_610;
  ulong *local_600;
  ulong local_5f8;
  undefined8 uStack_5f0;
  ulong *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_43c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  ulong local_1b8;
  undefined8 uStack_1b0;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  ulong local_198;
  undefined8 uStack_190;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  ulong local_178;
  undefined8 uStack_170;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  longlong local_e8;
  longlong lStack_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  longlong local_c8;
  longlong lStack_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  longlong local_a8;
  longlong lStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  longlong local_88;
  longlong lStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_9620 = *(long *)(res_clip_1[1] + 8);
  local_9624 = *(int *)(res_clip_1[1] + 0x10);
  local_9628 = in_R9D + -1 + (uint)*(ushort *)(res_16b_3[0] + 8);
  local_962c = 0x80;
  local_9638 = *(int *)res_clip_1[1];
  local_963c = *(int *)(res_clip_1[1] + 0x24);
  local_9640 = (*(ushort *)(res_16b_3[0] + 8) >> 1) - 1;
  local_9644 = (in_stack_00000008->taps >> 1) - 1;
  local_9650 = in_RDI + (long)(local_9640 * in_ESI) * -2 + (long)local_9644 * -2;
  local_9654 = *(undefined4 *)(res_clip_1[1] + 0x28);
  local_9658 = *(undefined4 *)(res_clip_1[1] + 0x2c);
  local_9668 = CONCAT44(local_9654,local_9654);
  lStack_9660 = CONCAT44(local_9654,local_9654);
  local_9678 = CONCAT44(local_9658,local_9658);
  lStack_9670 = CONCAT44(local_9658,local_9658);
  local_967c = (((int)res_16b_2[0] - *(int *)(res_clip_1[1] + 0x14)) -
               *(int *)(res_clip_1[1] + 0x18)) + 0xe;
  local_9680 = (1 << ((byte)local_967c & 0x1f)) + (1 << ((byte)local_967c - 1 & 0x1f));
  local_9698 = CONCAT44(local_9680,local_9680);
  lStack_9690 = CONCAT44(local_9680,local_9680);
  local_969c = 0xe - (*(int *)(res_clip_1[1] + 0x14) + *(int *)(res_clip_1[1] + 0x18));
  local_aac = (1 << ((byte)local_969c & 0x1f)) >> 1;
  local_96b8 = CONCAT44(local_aac,local_aac);
  lStack_96b0 = CONCAT44(local_aac,local_aac);
  if ((int)res_16b_2[0] == 10) {
    local_9b94 = 0x3ff;
  }
  else {
    local_9b94 = 0xff;
    if ((int)res_16b_2[0] == 0xc) {
      local_9b94 = 0xfff;
    }
  }
  local_a9a = local_9b94;
  local_96c8 = CONCAT26(local_9b94,CONCAT24(local_9b94,CONCAT22(local_9b94,local_9b94)));
  uStack_96c0 = CONCAT26(local_9b94,CONCAT24(local_9b94,CONCAT22(local_9b94,local_9b94)));
  local_b0c = in_R9D;
  local_b08 = in_R8D;
  local_b04 = in_ECX;
  local_b00 = in_RDX;
  local_af4 = in_ESI;
  local_aa8 = local_9680;
  local_aa4 = local_9658;
  local_aa0 = local_9654;
  local_e8 = local_9668;
  lStack_e0 = lStack_9660;
  local_d8 = local_9654;
  local_d4 = local_9654;
  local_d0 = local_9654;
  local_cc = local_9654;
  local_c8 = local_9678;
  lStack_c0 = lStack_9670;
  local_b8 = local_9658;
  local_b4 = local_9658;
  local_b0 = local_9658;
  local_ac = local_9658;
  local_a8 = local_9698;
  lStack_a0 = lStack_9690;
  local_98 = local_9680;
  local_94 = local_9680;
  local_90 = local_9680;
  local_8c = local_9680;
  local_88 = local_96b8;
  lStack_80 = lStack_96b0;
  local_78 = local_aac;
  local_74 = local_aac;
  local_70 = local_aac;
  local_6c = local_aac;
  local_28 = local_96c8;
  uStack_20 = uStack_96c0;
  local_10 = local_a9a;
  local_e = local_a9a;
  local_c = local_a9a;
  local_a = local_a9a;
  local_8 = local_a9a;
  local_6 = local_a9a;
  local_4 = local_a9a;
  local_2 = local_a9a;
  local_96d0 = av1_get_interp_filter_subpel_kernel(in_stack_00000008,(uint)res_16b_3[1] & 0xf);
  local_96e8 = *(undefined8 *)local_96d0;
  uStack_96e0 = *(undefined8 *)(local_96d0 + 4);
  local_4c8._0_4_ = (undefined4)local_96e8;
  local_4c8._4_4_ = (undefined4)((ulong)local_96e8 >> 0x20);
  local_96f8 = (undefined4)local_4c8;
  uStack_96f4 = (undefined4)local_4c8;
  uStack_96f0 = local_4c8._4_4_;
  uStack_96ec = local_4c8._4_4_;
  uStack_460._0_4_ = (undefined4)uStack_96e0;
  uStack_460._4_4_ = (undefined4)((ulong)uStack_96e0 >> 0x20);
  local_9708 = (undefined4)uStack_460;
  uStack_9704 = (undefined4)uStack_460;
  uStack_9700 = uStack_460._4_4_;
  uStack_96fc = uStack_460._4_4_;
  uStack_9710 = CONCAT44((undefined4)local_4c8,(undefined4)local_4c8);
  uStack_570 = CONCAT44(local_4c8._4_4_,local_4c8._4_4_);
  uStack_3dc = local_4c8._4_4_;
  local_3d8 = (undefined4)local_4c8;
  uStack_3ec = local_4c8._4_4_;
  _local_3e8 = CONCAT44((undefined4)local_4c8,(undefined4)local_4c8);
  uStack_9720 = uStack_3e0;
  uStack_971c = local_4c8._4_4_;
  local_9718 = CONCAT44(local_4c8._4_4_,uStack_3f0);
  local_9738 = CONCAT44((undefined4)uStack_460,(undefined4)uStack_460);
  uStack_590 = CONCAT44(uStack_460._4_4_,uStack_460._4_4_);
  local_418 = (undefined4)uStack_460;
  uStack_414 = (undefined4)uStack_460;
  uStack_3fc = uStack_460._4_4_;
  _local_3f8 = CONCAT44((undefined4)local_4c8,(undefined4)local_4c8);
  uStack_40c = uStack_460._4_4_;
  _local_408 = CONCAT44((undefined4)uStack_460,(undefined4)local_4c8);
  auVar16._4_8_ = uStack_590;
  auVar16._0_4_ = (undefined4)uStack_460;
  auVar94._0_8_ = auVar16._0_8_ << 0x20;
  auVar94._8_4_ = uStack_410;
  auVar94._12_4_ = uStack_460._4_4_;
  uStack_9740 = auVar94._8_8_;
  local_ab0 = ((1 << (*(byte *)(res_clip_1[1] + 0x14) & 0x1f)) >> 1) +
              (1 << ((char)res_16b_2[0] + 6U & 0x1f));
  local_9758 = CONCAT44(local_ab0,local_ab0);
  uStack_9750 = CONCAT44(local_ab0,local_ab0);
  local_ab8 = *(uint *)(res_clip_1[1] + 0x14);
  local_ac8._4_4_ = 0;
  local_ac8._0_4_ = local_ab8;
  local_9768 = local_ac8._0_8_;
  uStack_9760 = 0;
  for (local_9630 = 0; local_9630 < local_9628; local_9630 = local_9630 + 1) {
    for (local_9634 = 0; local_9634 < local_b08; local_9634 = local_9634 + 8) {
      local_a88 = (undefined1 (*) [16])
                  (local_9650 + (long)(local_9630 * local_af4 + local_9634) * 2);
      local_9778 = *(undefined8 *)*local_a88;
      uStack_9770 = *(undefined8 *)(*local_a88 + 8);
      local_a90 = (undefined1 (*) [16])
                  (local_9650 + 0x10 + (long)(local_9630 * local_af4 + local_9634) * 2);
      local_9788 = *(undefined8 *)*local_a90;
      uStack_9780 = *(undefined8 *)(*local_a90 + 8);
      local_1f8 = local_9718;
      auVar66._8_8_ = uStack_9710;
      auVar66._0_8_ = local_9718;
      local_9798 = pmaddwd(*local_a88,auVar66);
      auVar2._16_16_ = *local_a90;
      auVar2._0_16_ = *local_a88;
      local_208 = auVar2._4_16_;
      uStack_210 = CONCAT44(local_4c8._4_4_,uStack_3e0);
      auVar65._8_8_ = uStack_210;
      auVar65._0_8_ = local_9728;
      local_97a8 = pmaddwd(local_208,auVar65);
      auVar64._8_8_ = uStack_9770;
      auVar64._0_8_ = local_228;
      auVar63._8_8_ = local_9738;
      auVar63._0_8_ = local_9738;
      local_97b8 = pmaddwd(auVar64,auVar63);
      auVar3._16_16_ = *local_a90;
      auVar3._0_16_ = *local_a88;
      local_248 = auVar3._12_16_;
      local_258 = local_9748;
      auVar62._8_8_ = uStack_9740;
      auVar62._0_8_ = local_9748;
      local_97c8 = pmaddwd(local_248,auVar62);
      local_748 = local_9798._0_8_;
      uVar32 = local_748;
      uStack_740 = local_9798._8_8_;
      uVar33 = uStack_740;
      local_758 = local_97b8._0_8_;
      uVar30 = local_758;
      uStack_750 = local_97b8._8_8_;
      uVar31 = uStack_750;
      local_748._0_4_ = local_9798._0_4_;
      local_748._4_4_ = local_9798._4_4_;
      uStack_740._0_4_ = local_9798._8_4_;
      uStack_740._4_4_ = local_9798._12_4_;
      local_758._0_4_ = local_97b8._0_4_;
      local_758._4_4_ = local_97b8._4_4_;
      uStack_750._0_4_ = local_97b8._8_4_;
      uStack_750._4_4_ = local_97b8._12_4_;
      local_788 = (int)local_748 + (int)local_758;
      iStack_784 = local_748._4_4_ + local_758._4_4_;
      iStack_780 = (int)uStack_740 + (int)uStack_750;
      iStack_77c = uStack_740._4_4_ + uStack_750._4_4_;
      local_768 = local_97a8._0_8_;
      uVar28 = local_768;
      uStack_760 = local_97a8._8_8_;
      uVar29 = uStack_760;
      local_778 = local_97c8._0_8_;
      uVar26 = local_778;
      uStack_770 = local_97c8._8_8_;
      uVar27 = uStack_770;
      local_768._0_4_ = local_97a8._0_4_;
      local_768._4_4_ = local_97a8._4_4_;
      uStack_760._0_4_ = local_97a8._8_4_;
      uStack_760._4_4_ = local_97a8._12_4_;
      local_778._0_4_ = local_97c8._0_4_;
      local_778._4_4_ = local_97c8._4_4_;
      uStack_770._0_4_ = local_97c8._8_4_;
      uStack_770._4_4_ = local_97c8._12_4_;
      local_798 = (int)local_768 + (int)local_778;
      iStack_794 = local_768._4_4_ + local_778._4_4_;
      iStack_790 = (int)uStack_760 + (int)uStack_770;
      iStack_78c = uStack_760._4_4_ + uStack_770._4_4_;
      local_7a8 = CONCAT44(iStack_784 + iStack_794,local_788 + local_798);
      uStack_7a0 = CONCAT44(iStack_77c + iStack_78c,iStack_780 + iStack_790);
      local_168 = local_788 + local_798 + local_ab0;
      iStack_164 = iStack_784 + iStack_794 + local_ab0;
      iStack_160 = iStack_780 + iStack_790 + local_ab0;
      iStack_15c = iStack_77c + iStack_78c + local_ab0;
      local_178 = local_ac8._0_8_;
      uStack_170 = 0;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_ac8._0_8_;
      local_97d8 = local_168 >> auVar70;
      iStack_97d4 = iStack_164 >> auVar70;
      iStack_97d0 = iStack_160 >> auVar70;
      iStack_97cc = iStack_15c >> auVar70;
      auVar4._16_16_ = *local_a90;
      auVar4._0_16_ = *local_a88;
      local_268 = auVar4._2_16_;
      local_278 = local_9718;
      auVar61._8_8_ = uStack_9710;
      auVar61._0_8_ = local_9718;
      local_97e8 = pmaddwd(local_268,auVar61);
      auVar5._16_16_ = *local_a90;
      auVar5._0_16_ = *local_a88;
      local_288 = auVar5._6_16_;
      uStack_290 = CONCAT44(local_4c8._4_4_,uStack_3e0);
      local_298 = local_9728;
      auVar60._8_8_ = uStack_290;
      auVar60._0_8_ = local_9728;
      local_97f8 = pmaddwd(local_288,auVar60);
      auVar6._16_16_ = *local_a90;
      auVar6._0_16_ = *local_a88;
      local_2a8 = auVar6._10_16_;
      auVar59._8_8_ = local_9738;
      auVar59._0_8_ = local_9738;
      local_9808 = pmaddwd(local_2a8,auVar59);
      auVar7._16_16_ = *local_a90;
      auVar7._0_16_ = *local_a88;
      local_2c8 = auVar7._14_16_;
      local_2d8 = local_9748;
      auVar58._8_8_ = uStack_9740;
      auVar58._0_8_ = local_9748;
      local_9818 = pmaddwd(local_2c8,auVar58);
      local_7c8 = local_97e8._0_8_;
      uVar24 = local_7c8;
      uStack_7c0 = local_97e8._8_8_;
      uVar25 = uStack_7c0;
      local_7d8 = local_9808._0_8_;
      uVar22 = local_7d8;
      uStack_7d0 = local_9808._8_8_;
      uVar23 = uStack_7d0;
      local_7c8._0_4_ = local_97e8._0_4_;
      local_7c8._4_4_ = local_97e8._4_4_;
      uStack_7c0._0_4_ = local_97e8._8_4_;
      uStack_7c0._4_4_ = local_97e8._12_4_;
      local_7d8._0_4_ = local_9808._0_4_;
      local_7d8._4_4_ = local_9808._4_4_;
      uStack_7d0._0_4_ = local_9808._8_4_;
      uStack_7d0._4_4_ = local_9808._12_4_;
      local_808 = (int)local_7c8 + (int)local_7d8;
      iStack_804 = local_7c8._4_4_ + local_7d8._4_4_;
      iStack_800 = (int)uStack_7c0 + (int)uStack_7d0;
      iStack_7fc = uStack_7c0._4_4_ + uStack_7d0._4_4_;
      local_7e8 = local_97f8._0_8_;
      uVar20 = local_7e8;
      uStack_7e0 = local_97f8._8_8_;
      uVar21 = uStack_7e0;
      local_7f8 = local_9818._0_8_;
      uVar18 = local_7f8;
      uStack_7f0 = local_9818._8_8_;
      uVar19 = uStack_7f0;
      local_7e8._0_4_ = local_97f8._0_4_;
      local_7e8._4_4_ = local_97f8._4_4_;
      uStack_7e0._0_4_ = local_97f8._8_4_;
      uStack_7e0._4_4_ = local_97f8._12_4_;
      local_7f8._0_4_ = local_9818._0_4_;
      local_7f8._4_4_ = local_9818._4_4_;
      uStack_7f0._0_4_ = local_9818._8_4_;
      uStack_7f0._4_4_ = local_9818._12_4_;
      local_818 = (int)local_7e8 + (int)local_7f8;
      iStack_814 = local_7e8._4_4_ + local_7f8._4_4_;
      iStack_810 = (int)uStack_7e0 + (int)uStack_7f0;
      iStack_80c = uStack_7e0._4_4_ + uStack_7f0._4_4_;
      local_828 = CONCAT44(iStack_804 + iStack_814,local_808 + local_818);
      uStack_820 = CONCAT44(iStack_7fc + iStack_80c,iStack_800 + iStack_810);
      local_188 = local_808 + local_818 + local_ab0;
      iStack_184 = iStack_804 + iStack_814 + local_ab0;
      iStack_180 = iStack_800 + iStack_810 + local_ab0;
      iStack_17c = iStack_7fc + iStack_80c + local_ab0;
      local_198 = local_ac8._0_8_;
      uStack_190 = 0;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_ac8._0_8_;
      local_9828 = local_188 >> auVar69;
      iStack_9824 = iStack_184 >> auVar69;
      iStack_9820 = iStack_180 >> auVar69;
      iStack_981c = iStack_17c >> auVar69;
      local_148 = CONCAT44(iStack_97d4,local_97d8);
      uStack_140 = CONCAT44(iStack_97cc,iStack_97d0);
      local_158 = CONCAT44(iStack_9824,local_9828);
      uStack_150 = CONCAT44(iStack_981c,iStack_9820);
      auVar72._8_8_ = uStack_140;
      auVar72._0_8_ = local_148;
      auVar71._8_8_ = uStack_150;
      auVar71._0_8_ = local_158;
      local_9838 = packssdw(auVar72,auVar71);
      lVar93 = (long)(local_9630 * local_962c + local_9634) * 2;
      local_120 = (undefined8 *)((long)local_9618 + lVar93);
      local_138 = local_9838._0_8_;
      uStack_130 = local_9838._8_8_;
      *local_120 = local_9838._0_8_;
      *(undefined8 *)((long)local_9618 + lVar93 + 8) = local_9838._8_8_;
      local_838 = local_9758;
      uStack_830 = uStack_9750;
      local_7f8 = uVar18;
      uStack_7f0 = uVar19;
      local_7e8 = uVar20;
      uStack_7e0 = uVar21;
      local_7d8 = uVar22;
      uStack_7d0 = uVar23;
      local_7c8 = uVar24;
      uStack_7c0 = uVar25;
      local_7b8 = local_9758;
      uStack_7b0 = uStack_9750;
      local_778 = uVar26;
      uStack_770 = uVar27;
      local_768 = uVar28;
      uStack_760 = uVar29;
      local_758 = uVar30;
      uStack_750 = uVar31;
      local_748 = uVar32;
      uStack_740 = uVar33;
      uStack_2d0 = uStack_9740;
      local_2b8 = local_9738;
      uStack_2b0 = local_9738;
      uStack_270 = uStack_9710;
      uStack_250 = uStack_9740;
      local_238 = local_9738;
      uStack_230 = local_9738;
      uStack_220 = uStack_9770;
      local_218 = local_9778;
      uStack_1f0 = uStack_9710;
      local_1e8 = local_9778;
      uStack_1e0 = uStack_9770;
    }
  }
  uStack_9730 = local_9738;
  local_ac8 = ZEXT416(local_ab8);
  local_a80 = local_96d0;
  local_598 = local_9738;
  local_588 = local_9738;
  uStack_580 = uStack_590;
  local_578 = uStack_9710;
  local_568 = uStack_9710;
  uStack_560 = uStack_570;
  local_4d8 = local_96e8;
  uStack_4d0 = uStack_96e0;
  local_4c8 = local_96e8;
  uStack_4c0 = uStack_96e0;
  local_478 = local_96e8;
  uStack_470 = uStack_96e0;
  local_468 = local_96e8;
  uStack_460 = uStack_96e0;
  local_68 = local_9758;
  uStack_60 = uStack_9750;
  local_58 = local_ab0;
  local_54 = local_ab0;
  local_50 = local_ab0;
  local_4c = local_ab0;
  local_9840 = av1_get_interp_filter_subpel_kernel
                         ((InterpFilterParams *)res_16b_3[0],(uint)res_clip_1[0] & 0xf);
  local_9858 = *(undefined8 *)local_9840;
  uStack_9850 = *(undefined8 *)(local_9840 + 4);
  local_4e8._0_4_ = (undefined4)local_9858;
  local_4e8._4_4_ = (undefined4)((ulong)local_9858 >> 0x20);
  local_9868 = (undefined4)local_4e8;
  uStack_9864 = (undefined4)local_4e8;
  uStack_9860 = local_4e8._4_4_;
  uStack_985c = local_4e8._4_4_;
  uStack_480._0_4_ = (undefined4)uStack_9850;
  uStack_480._4_4_ = (undefined4)((ulong)uStack_9850 >> 0x20);
  local_9878 = (undefined4)uStack_480;
  uStack_9874 = (undefined4)uStack_480;
  uStack_9870 = uStack_480._4_4_;
  uStack_986c = uStack_480._4_4_;
  uStack_9880 = CONCAT44((undefined4)local_4e8,(undefined4)local_4e8);
  uStack_5b0 = CONCAT44(local_4e8._4_4_,local_4e8._4_4_);
  uStack_41c = local_4e8._4_4_;
  _local_418 = CONCAT44(uStack_414,(undefined4)local_4e8);
  uStack_42c = local_4e8._4_4_;
  _local_428 = CONCAT44((undefined4)local_4e8,(undefined4)local_4e8);
  uStack_9890 = uStack_420;
  uStack_988c = local_4e8._4_4_;
  local_9888 = CONCAT44(local_4e8._4_4_,uStack_430);
  local_98a8 = CONCAT44((undefined4)uStack_480,(undefined4)uStack_480);
  uStack_5d0 = CONCAT44(uStack_480._4_4_,uStack_480._4_4_);
  local_458 = CONCAT44((undefined4)uStack_480,(undefined4)uStack_480);
  uStack_43c = uStack_480._4_4_;
  _local_438 = CONCAT44((undefined4)local_4e8,(undefined4)local_4e8);
  uStack_44c = uStack_480._4_4_;
  _local_448 = CONCAT44((undefined4)uStack_480,(undefined4)local_4e8);
  auVar17._4_8_ = uStack_5d0;
  auVar17._0_4_ = (undefined4)uStack_480;
  auVar95._0_8_ = auVar17._0_8_ << 0x20;
  auVar95._8_4_ = uStack_450;
  auVar95._12_4_ = uStack_480._4_4_;
  uStack_98b0 = auVar95._8_8_;
  local_ab4 = ((1 << (*(byte *)(res_clip_1[1] + 0x18) & 0x1f)) >> 1) -
              (1 << (((char)res_16b_2[0] - (char)*(undefined4 *)(res_clip_1[1] + 0x14)) + 0xdU &
                    0x1f));
  local_98c8 = CONCAT44(local_ab4,local_ab4);
  uStack_98c0 = CONCAT44(local_ab4,local_ab4);
  local_acc = *(uint *)(res_clip_1[1] + 0x18);
  local_ae8._4_4_ = 0;
  local_ae8._0_4_ = local_acc;
  local_98d8 = local_ae8._0_8_;
  uStack_98d0 = 0;
  uStack_98a0 = local_98a8;
  local_ae8 = ZEXT416(local_acc);
  local_a98 = local_9840;
  local_5d8 = local_98a8;
  local_5c8 = local_98a8;
  uStack_5c0 = uStack_5d0;
  local_5b8 = uStack_9880;
  local_5a8 = uStack_9880;
  uStack_5a0 = uStack_5b0;
  local_4f8 = local_9858;
  uStack_4f0 = uStack_9850;
  local_4e8 = local_9858;
  uStack_4e0 = uStack_9850;
  local_498 = local_9858;
  uStack_490 = uStack_9850;
  local_488 = local_9858;
  uStack_480 = uStack_9850;
  local_48 = local_98c8;
  uStack_40 = uStack_98c0;
  local_38 = local_ab4;
  local_34 = local_ab4;
  local_30 = local_ab4;
  local_2c = local_ab4;
  for (local_9630 = 0; local_9630 < local_b0c; local_9630 = local_9630 + 1) {
    for (local_9634 = 0; local_9634 < local_b08; local_9634 = local_9634 + 8) {
      lVar93 = (long)(local_9630 * local_962c + local_9634) * 2;
      local_98e0 = (undefined8 *)((long)local_9618 + lVar93);
      uVar18 = *local_98e0;
      uStack_a00 = *(undefined8 *)((long)local_9618 + lVar93 + 8);
      puVar1 = (undefined8 *)((long)local_98e0 + (long)local_962c * 2);
      uVar19 = *puVar1;
      uStack_a10 = puVar1[1];
      local_a08._0_2_ = (undefined2)uVar18;
      local_a08._2_2_ = (undefined2)((ulong)uVar18 >> 0x10);
      local_a08._4_2_ = (undefined2)((ulong)uVar18 >> 0x20);
      local_a08._6_2_ = (undefined2)((ulong)uVar18 >> 0x30);
      local_a18._0_2_ = (undefined2)uVar19;
      local_a18._2_2_ = (undefined2)((ulong)uVar19 >> 0x10);
      local_a18._4_2_ = (undefined2)((ulong)uVar19 >> 0x20);
      local_a18._6_2_ = (undefined2)((ulong)uVar19 >> 0x30);
      local_98f8 = (undefined2)local_a08;
      uStack_98f6 = (undefined2)local_a18;
      uStack_98f4 = local_a08._2_2_;
      uStack_98f2 = local_a18._2_2_;
      uStack_98f0 = local_a08._4_2_;
      uStack_98ee = local_a18._4_2_;
      uStack_98ec = local_a08._6_2_;
      uStack_98ea = local_a18._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 2) * 2);
      uVar20 = *puVar1;
      uStack_a20 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 3) * 2);
      uVar21 = *puVar1;
      uStack_a30 = puVar1[1];
      local_a28._0_2_ = (undefined2)uVar20;
      local_a28._2_2_ = (undefined2)((ulong)uVar20 >> 0x10);
      local_a28._4_2_ = (undefined2)((ulong)uVar20 >> 0x20);
      local_a28._6_2_ = (undefined2)((ulong)uVar20 >> 0x30);
      local_a38._0_2_ = (undefined2)uVar21;
      local_a38._2_2_ = (undefined2)((ulong)uVar21 >> 0x10);
      local_a38._4_2_ = (undefined2)((ulong)uVar21 >> 0x20);
      local_a38._6_2_ = (undefined2)((ulong)uVar21 >> 0x30);
      local_9908 = (undefined2)local_a28;
      uStack_9906 = (undefined2)local_a38;
      uStack_9904 = local_a28._2_2_;
      uStack_9902 = local_a38._2_2_;
      uStack_9900 = local_a28._4_2_;
      uStack_98fe = local_a38._4_2_;
      uStack_98fc = local_a28._6_2_;
      uStack_98fa = local_a38._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c << 2) * 2);
      uVar22 = *puVar1;
      uStack_a40 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 5) * 2);
      uVar23 = *puVar1;
      uStack_a50 = puVar1[1];
      local_a48._0_2_ = (undefined2)uVar22;
      local_a48._2_2_ = (undefined2)((ulong)uVar22 >> 0x10);
      local_a48._4_2_ = (undefined2)((ulong)uVar22 >> 0x20);
      local_a48._6_2_ = (undefined2)((ulong)uVar22 >> 0x30);
      local_a58._0_2_ = (undefined2)uVar23;
      local_a58._2_2_ = (undefined2)((ulong)uVar23 >> 0x10);
      local_a58._4_2_ = (undefined2)((ulong)uVar23 >> 0x20);
      local_a58._6_2_ = (undefined2)((ulong)uVar23 >> 0x30);
      local_9918 = (undefined2)local_a48;
      uStack_9916 = (undefined2)local_a58;
      uStack_9914 = local_a48._2_2_;
      uStack_9912 = local_a58._2_2_;
      uStack_9910 = local_a48._4_2_;
      uStack_990e = local_a58._4_2_;
      uStack_990c = local_a48._6_2_;
      uStack_990a = local_a58._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 6) * 2);
      uVar24 = *puVar1;
      uStack_a60 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 7) * 2);
      uVar25 = *puVar1;
      uStack_a70 = puVar1[1];
      local_a68._0_2_ = (undefined2)uVar24;
      local_a68._2_2_ = (undefined2)((ulong)uVar24 >> 0x10);
      local_a68._4_2_ = (undefined2)((ulong)uVar24 >> 0x20);
      local_a68._6_2_ = (undefined2)((ulong)uVar24 >> 0x30);
      local_a78._0_2_ = (undefined2)uVar25;
      local_a78._2_2_ = (undefined2)((ulong)uVar25 >> 0x10);
      local_a78._4_2_ = (undefined2)((ulong)uVar25 >> 0x20);
      local_a78._6_2_ = (undefined2)((ulong)uVar25 >> 0x30);
      local_9928 = (undefined2)local_a68;
      uStack_9926 = (undefined2)local_a78;
      uStack_9924 = local_a68._2_2_;
      uStack_9922 = local_a78._2_2_;
      uStack_9920 = local_a68._4_2_;
      uStack_991e = local_a78._4_2_;
      uStack_991c = local_a68._6_2_;
      uStack_991a = local_a78._6_2_;
      local_2e8 = CONCAT26(local_a18._2_2_,
                           CONCAT24(local_a08._2_2_,
                                    CONCAT22((undefined2)local_a18,(undefined2)local_a08)));
      uStack_2e0 = CONCAT26(local_a18._6_2_,
                            CONCAT24(local_a08._6_2_,CONCAT22(local_a18._4_2_,local_a08._4_2_)));
      local_2f8 = local_9888;
      uStack_2f0 = uStack_9880;
      auVar57._8_8_ = uStack_2e0;
      auVar57._0_8_ = local_2e8;
      auVar56._8_8_ = uStack_9880;
      auVar56._0_8_ = local_9888;
      local_9938 = pmaddwd(auVar57,auVar56);
      local_308 = CONCAT26(local_a38._2_2_,
                           CONCAT24(local_a28._2_2_,
                                    CONCAT22((undefined2)local_a38,(undefined2)local_a28)));
      uStack_300 = CONCAT26(local_a38._6_2_,
                            CONCAT24(local_a28._6_2_,CONCAT22(local_a38._4_2_,local_a28._4_2_)));
      uStack_310 = CONCAT44(uStack_988c,uStack_9890);
      local_318 = local_9898;
      auVar55._8_8_ = uStack_300;
      auVar55._0_8_ = local_308;
      auVar54._8_8_ = uStack_310;
      auVar54._0_8_ = local_9898;
      local_9948 = pmaddwd(auVar55,auVar54);
      local_328 = CONCAT26(local_a58._2_2_,
                           CONCAT24(local_a48._2_2_,
                                    CONCAT22((undefined2)local_a58,(undefined2)local_a48)));
      uStack_320 = CONCAT26(local_a58._6_2_,
                            CONCAT24(local_a48._6_2_,CONCAT22(local_a58._4_2_,local_a48._4_2_)));
      local_338 = local_98a8;
      uStack_330 = uStack_98a0;
      auVar53._8_8_ = uStack_320;
      auVar53._0_8_ = local_328;
      auVar52._8_8_ = uStack_98a0;
      auVar52._0_8_ = local_98a8;
      local_9958 = pmaddwd(auVar53,auVar52);
      local_348 = CONCAT26(local_a78._2_2_,
                           CONCAT24(local_a68._2_2_,
                                    CONCAT22((undefined2)local_a78,(undefined2)local_a68)));
      uStack_340 = CONCAT26(local_a78._6_2_,
                            CONCAT24(local_a68._6_2_,CONCAT22(local_a78._4_2_,local_a68._4_2_)));
      local_358 = local_98b8;
      uStack_350 = uStack_98b0;
      auVar51._8_8_ = uStack_340;
      auVar51._0_8_ = local_348;
      auVar50._8_8_ = uStack_98b0;
      auVar50._0_8_ = local_98b8;
      local_9968 = pmaddwd(auVar51,auVar50);
      local_848 = local_9938._0_8_;
      uVar91 = local_848;
      uStack_840 = local_9938._8_8_;
      uVar92 = uStack_840;
      local_858 = local_9948._0_8_;
      uVar89 = local_858;
      uStack_850 = local_9948._8_8_;
      uVar90 = uStack_850;
      local_848._0_4_ = local_9938._0_4_;
      local_848._4_4_ = local_9938._4_4_;
      uStack_840._0_4_ = local_9938._8_4_;
      uStack_840._4_4_ = local_9938._12_4_;
      local_858._0_4_ = local_9948._0_4_;
      local_858._4_4_ = local_9948._4_4_;
      uStack_850._0_4_ = local_9948._8_4_;
      uStack_850._4_4_ = local_9948._12_4_;
      local_888 = (int)local_848 + (int)local_858;
      iStack_884 = local_848._4_4_ + local_858._4_4_;
      iStack_880 = (int)uStack_840 + (int)uStack_850;
      iStack_87c = uStack_840._4_4_ + uStack_850._4_4_;
      local_868 = local_9958._0_8_;
      uVar87 = local_868;
      uStack_860 = local_9958._8_8_;
      uVar88 = uStack_860;
      local_878 = local_9968._0_8_;
      uVar85 = local_878;
      uStack_870 = local_9968._8_8_;
      uVar86 = uStack_870;
      local_868._0_4_ = local_9958._0_4_;
      local_868._4_4_ = local_9958._4_4_;
      uStack_860._0_4_ = local_9958._8_4_;
      uStack_860._4_4_ = local_9958._12_4_;
      local_878._0_4_ = local_9968._0_4_;
      local_878._4_4_ = local_9968._4_4_;
      uStack_870._0_4_ = local_9968._8_4_;
      uStack_870._4_4_ = local_9968._12_4_;
      local_898 = (int)local_868 + (int)local_878;
      iStack_894 = local_868._4_4_ + local_878._4_4_;
      iStack_890 = (int)uStack_860 + (int)uStack_870;
      iStack_88c = uStack_860._4_4_ + uStack_870._4_4_;
      local_9a18 = local_888 + local_898;
      iStack_9a10 = iStack_884 + iStack_894;
      local_9a28 = iStack_880 + iStack_890;
      iStack_9a20 = iStack_87c + iStack_88c;
      local_988 = *local_98e0;
      uVar26 = *(undefined8 *)((long)local_9618 + lVar93 + 8);
      puVar1 = (undefined8 *)((long)local_98e0 + (long)local_962c * 2);
      local_998 = *puVar1;
      uVar27 = puVar1[1];
      uStack_980._0_2_ = (undefined2)uVar26;
      uStack_980._2_2_ = (undefined2)((ulong)uVar26 >> 0x10);
      uStack_980._4_2_ = (undefined2)((ulong)uVar26 >> 0x20);
      uStack_980._6_2_ = (undefined2)((ulong)uVar26 >> 0x30);
      uStack_990._0_2_ = (undefined2)uVar27;
      uStack_990._2_2_ = (undefined2)((ulong)uVar27 >> 0x10);
      uStack_990._4_2_ = (undefined2)((ulong)uVar27 >> 0x20);
      uStack_990._6_2_ = (undefined2)((ulong)uVar27 >> 0x30);
      local_9988 = (undefined2)uStack_980;
      uStack_9986 = (undefined2)uStack_990;
      uStack_9984 = uStack_980._2_2_;
      uStack_9982 = uStack_990._2_2_;
      uStack_9980 = uStack_980._4_2_;
      uStack_997e = uStack_990._4_2_;
      uStack_997c = uStack_980._6_2_;
      uStack_997a = uStack_990._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 2) * 2);
      local_9a8 = *puVar1;
      uVar28 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 3) * 2);
      local_9b8 = *puVar1;
      uVar29 = puVar1[1];
      uStack_9a0._0_2_ = (undefined2)uVar28;
      uStack_9a0._2_2_ = (undefined2)((ulong)uVar28 >> 0x10);
      uStack_9a0._4_2_ = (undefined2)((ulong)uVar28 >> 0x20);
      uStack_9a0._6_2_ = (undefined2)((ulong)uVar28 >> 0x30);
      uStack_9b0._0_2_ = (undefined2)uVar29;
      uStack_9b0._2_2_ = (undefined2)((ulong)uVar29 >> 0x10);
      uStack_9b0._4_2_ = (undefined2)((ulong)uVar29 >> 0x20);
      uStack_9b0._6_2_ = (undefined2)((ulong)uVar29 >> 0x30);
      local_9998 = (undefined2)uStack_9a0;
      uStack_9996 = (undefined2)uStack_9b0;
      uStack_9994 = uStack_9a0._2_2_;
      uStack_9992 = uStack_9b0._2_2_;
      uStack_9990 = uStack_9a0._4_2_;
      uStack_998e = uStack_9b0._4_2_;
      uStack_998c = uStack_9a0._6_2_;
      uStack_998a = uStack_9b0._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c << 2) * 2);
      local_9c8 = *puVar1;
      uVar30 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 5) * 2);
      local_9d8 = *puVar1;
      uVar31 = puVar1[1];
      uStack_9c0._0_2_ = (undefined2)uVar30;
      uStack_9c0._2_2_ = (undefined2)((ulong)uVar30 >> 0x10);
      uStack_9c0._4_2_ = (undefined2)((ulong)uVar30 >> 0x20);
      uStack_9c0._6_2_ = (undefined2)((ulong)uVar30 >> 0x30);
      uStack_9d0._0_2_ = (undefined2)uVar31;
      uStack_9d0._2_2_ = (undefined2)((ulong)uVar31 >> 0x10);
      uStack_9d0._4_2_ = (undefined2)((ulong)uVar31 >> 0x20);
      uStack_9d0._6_2_ = (undefined2)((ulong)uVar31 >> 0x30);
      local_99a8 = (undefined2)uStack_9c0;
      uStack_99a6 = (undefined2)uStack_9d0;
      uStack_99a4 = uStack_9c0._2_2_;
      uStack_99a2 = uStack_9d0._2_2_;
      uStack_99a0 = uStack_9c0._4_2_;
      uStack_999e = uStack_9d0._4_2_;
      uStack_999c = uStack_9c0._6_2_;
      uStack_999a = uStack_9d0._6_2_;
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 6) * 2);
      local_9e8 = *puVar1;
      uVar32 = puVar1[1];
      puVar1 = (undefined8 *)((long)local_98e0 + (long)(local_962c * 7) * 2);
      local_9f8 = *puVar1;
      uVar33 = puVar1[1];
      uStack_9e0._0_2_ = (undefined2)uVar32;
      uStack_9e0._2_2_ = (undefined2)((ulong)uVar32 >> 0x10);
      uStack_9e0._4_2_ = (undefined2)((ulong)uVar32 >> 0x20);
      uStack_9e0._6_2_ = (undefined2)((ulong)uVar32 >> 0x30);
      uStack_9f0._0_2_ = (undefined2)uVar33;
      uStack_9f0._2_2_ = (undefined2)((ulong)uVar33 >> 0x10);
      uStack_9f0._4_2_ = (undefined2)((ulong)uVar33 >> 0x20);
      uStack_9f0._6_2_ = (undefined2)((ulong)uVar33 >> 0x30);
      local_99b8 = (undefined2)uStack_9e0;
      uStack_99b6 = (undefined2)uStack_9f0;
      uStack_99b4 = uStack_9e0._2_2_;
      uStack_99b2 = uStack_9f0._2_2_;
      uStack_99b0 = uStack_9e0._4_2_;
      uStack_99ae = uStack_9f0._4_2_;
      uStack_99ac = uStack_9e0._6_2_;
      uStack_99aa = uStack_9f0._6_2_;
      local_368 = CONCAT26(uStack_990._2_2_,
                           CONCAT24(uStack_980._2_2_,
                                    CONCAT22((undefined2)uStack_990,(undefined2)uStack_980)));
      uStack_360 = CONCAT26(uStack_990._6_2_,
                            CONCAT24(uStack_980._6_2_,CONCAT22(uStack_990._4_2_,uStack_980._4_2_)));
      local_378 = local_9888;
      uStack_370 = uStack_9880;
      auVar49._8_8_ = uStack_360;
      auVar49._0_8_ = local_368;
      auVar48._8_8_ = uStack_9880;
      auVar48._0_8_ = local_9888;
      local_99c8 = pmaddwd(auVar49,auVar48);
      local_388 = CONCAT26(uStack_9b0._2_2_,
                           CONCAT24(uStack_9a0._2_2_,
                                    CONCAT22((undefined2)uStack_9b0,(undefined2)uStack_9a0)));
      uStack_380 = CONCAT26(uStack_9b0._6_2_,
                            CONCAT24(uStack_9a0._6_2_,CONCAT22(uStack_9b0._4_2_,uStack_9a0._4_2_)));
      uStack_390 = CONCAT44(uStack_988c,uStack_9890);
      local_398 = local_9898;
      auVar47._8_8_ = uStack_380;
      auVar47._0_8_ = local_388;
      auVar46._8_8_ = uStack_390;
      auVar46._0_8_ = local_9898;
      local_99d8 = pmaddwd(auVar47,auVar46);
      local_3a8 = CONCAT26(uStack_9d0._2_2_,
                           CONCAT24(uStack_9c0._2_2_,
                                    CONCAT22((undefined2)uStack_9d0,(undefined2)uStack_9c0)));
      uStack_3a0 = CONCAT26(uStack_9d0._6_2_,
                            CONCAT24(uStack_9c0._6_2_,CONCAT22(uStack_9d0._4_2_,uStack_9c0._4_2_)));
      local_3b8 = local_98a8;
      uStack_3b0 = uStack_98a0;
      auVar45._8_8_ = uStack_3a0;
      auVar45._0_8_ = local_3a8;
      auVar44._8_8_ = uStack_98a0;
      auVar44._0_8_ = local_98a8;
      local_99e8 = pmaddwd(auVar45,auVar44);
      local_3c8 = CONCAT26(uStack_9f0._2_2_,
                           CONCAT24(uStack_9e0._2_2_,
                                    CONCAT22((undefined2)uStack_9f0,(undefined2)uStack_9e0)));
      uStack_3c0 = CONCAT26(uStack_9f0._6_2_,
                            CONCAT24(uStack_9e0._6_2_,CONCAT22(uStack_9f0._4_2_,uStack_9e0._4_2_)));
      local_3d8 = (undefined4)local_98b8;
      uStack_3d4 = (undefined4)((ulong)local_98b8 >> 0x20);
      uStack_3d0 = uStack_98b0;
      auVar43._8_8_ = uStack_3c0;
      auVar43._0_8_ = local_3c8;
      auVar42._8_8_ = uStack_98b0;
      auVar42._0_8_ = local_98b8;
      local_99f8 = pmaddwd(auVar43,auVar42);
      local_8a8 = local_99c8._0_8_;
      uVar83 = local_8a8;
      uStack_8a0 = local_99c8._8_8_;
      uVar84 = uStack_8a0;
      local_8b8 = local_99d8._0_8_;
      uVar81 = local_8b8;
      uStack_8b0 = local_99d8._8_8_;
      uVar82 = uStack_8b0;
      local_8a8._0_4_ = local_99c8._0_4_;
      local_8a8._4_4_ = local_99c8._4_4_;
      uStack_8a0._0_4_ = local_99c8._8_4_;
      uStack_8a0._4_4_ = local_99c8._12_4_;
      local_8b8._0_4_ = local_99d8._0_4_;
      local_8b8._4_4_ = local_99d8._4_4_;
      uStack_8b0._0_4_ = local_99d8._8_4_;
      uStack_8b0._4_4_ = local_99d8._12_4_;
      local_8e8 = (int)local_8a8 + (int)local_8b8;
      iStack_8e4 = local_8a8._4_4_ + local_8b8._4_4_;
      iStack_8e0 = (int)uStack_8a0 + (int)uStack_8b0;
      iStack_8dc = uStack_8a0._4_4_ + uStack_8b0._4_4_;
      local_8c8 = local_99e8._0_8_;
      uVar79 = local_8c8;
      uStack_8c0 = local_99e8._8_8_;
      uVar80 = uStack_8c0;
      local_8d8 = local_99f8._0_8_;
      uVar77 = local_8d8;
      uStack_8d0 = local_99f8._8_8_;
      uVar78 = uStack_8d0;
      local_8c8._0_4_ = local_99e8._0_4_;
      local_8c8._4_4_ = local_99e8._4_4_;
      uStack_8c0._0_4_ = local_99e8._8_4_;
      uStack_8c0._4_4_ = local_99e8._12_4_;
      local_8d8._0_4_ = local_99f8._0_4_;
      local_8d8._4_4_ = local_99f8._4_4_;
      uStack_8d0._0_4_ = local_99f8._8_4_;
      uStack_8d0._4_4_ = local_99f8._12_4_;
      local_8f8 = (int)local_8c8 + (int)local_8d8;
      iStack_8f4 = local_8c8._4_4_ + local_8d8._4_4_;
      iStack_8f0 = (int)uStack_8c0 + (int)uStack_8d0;
      iStack_8ec = uStack_8c0._4_4_ + uStack_8d0._4_4_;
      iStack_9a14 = local_8e8 + local_8f8;
      iStack_9a0c = iStack_8e4 + iStack_8f4;
      iStack_9a24 = iStack_8e0 + iStack_8f0;
      iStack_9a1c = iStack_8dc + iStack_8ec;
      local_508 = CONCAT44(iStack_9a10,local_9a18);
      uStack_500 = CONCAT44(iStack_9a20,local_9a28);
      local_518 = CONCAT44(iStack_9a0c,iStack_9a14);
      uStack_510 = CONCAT44(iStack_9a1c,iStack_9a24);
      local_4a8 = CONCAT44(iStack_9a10,local_9a18);
      uStack_4a0 = CONCAT44(iStack_9a20,local_9a28);
      local_4b8 = CONCAT44(iStack_9a0c,iStack_9a14);
      uStack_4b0 = CONCAT44(iStack_9a1c,iStack_9a24);
      local_908 = CONCAT44(iStack_9a14,local_9a18);
      uStack_900 = CONCAT44(iStack_9a0c,iStack_9a10);
      local_918 = local_98c8;
      uVar75 = local_918;
      uStack_910 = uStack_98c0;
      uVar76 = uStack_910;
      local_918._0_4_ = (int)local_98c8;
      local_918._4_4_ = (int)((ulong)local_98c8 >> 0x20);
      uStack_910._0_4_ = (int)uStack_98c0;
      uStack_910._4_4_ = (int)((ulong)uStack_98c0 >> 0x20);
      local_1a8 = local_9a18 + (int)local_918;
      iStack_1a4 = iStack_9a14 + local_918._4_4_;
      iStack_1a0 = iStack_9a10 + (int)uStack_910;
      iStack_19c = iStack_9a0c + uStack_910._4_4_;
      local_1b8 = local_98d8;
      uStack_1b0 = uStack_98d0;
      auVar68._8_8_ = uStack_98d0;
      auVar68._0_8_ = local_98d8;
      local_9a38 = local_1a8 >> auVar68;
      iStack_9a34 = iStack_1a4 >> auVar68;
      iStack_9a30 = iStack_1a0 >> auVar68;
      iStack_9a2c = iStack_19c >> auVar68;
      local_928 = CONCAT44(iStack_9a34,local_9a38);
      uStack_920 = CONCAT44(iStack_9a2c,iStack_9a30);
      local_938 = local_9698;
      lVar73 = local_938;
      uStack_930 = lStack_9690;
      lVar74 = uStack_930;
      local_938._0_4_ = (int)local_9698;
      local_938._4_4_ = (int)((ulong)local_9698 >> 0x20);
      uStack_930._0_4_ = (int)lStack_9690;
      uStack_930._4_4_ = (int)((ulong)lStack_9690 >> 0x20);
      local_9a48 = local_9a38 + (int)local_938;
      iStack_9a44 = iStack_9a34 + local_938._4_4_;
      iStack_9a40 = iStack_9a30 + (int)uStack_930;
      iStack_9a3c = iStack_9a2c + uStack_930._4_4_;
      local_9a08 = iStack_9a14;
      iStack_9a04 = iStack_9a0c;
      iStack_9a00 = iStack_9a24;
      iStack_99fc = iStack_9a1c;
      local_9978 = local_9a18;
      iStack_9974 = iStack_9a10;
      iStack_9970 = local_9a28;
      iStack_996c = iStack_9a20;
      local_a78 = uVar25;
      local_a68 = uVar24;
      local_a58 = uVar23;
      local_a48 = uVar22;
      local_a38 = uVar21;
      local_a28 = uVar20;
      local_a18 = uVar19;
      local_a08 = uVar18;
      uStack_9f0 = uVar33;
      uStack_9e0 = uVar32;
      uStack_9d0 = uVar31;
      uStack_9c0 = uVar30;
      uStack_9b0 = uVar29;
      uStack_9a0 = uVar28;
      uStack_990 = uVar27;
      uStack_980 = uVar26;
      local_938 = lVar73;
      uStack_930 = lVar74;
      local_918 = uVar75;
      uStack_910 = uVar76;
      local_8d8 = uVar77;
      uStack_8d0 = uVar78;
      local_8c8 = uVar79;
      uStack_8c0 = uVar80;
      local_8b8 = uVar81;
      uStack_8b0 = uVar82;
      local_8a8 = uVar83;
      uStack_8a0 = uVar84;
      local_878 = uVar85;
      uStack_870 = uVar86;
      local_868 = uVar87;
      uStack_860 = uVar88;
      local_858 = uVar89;
      uStack_850 = uVar90;
      local_848 = uVar91;
      uStack_840 = uVar92;
      if (local_b08 < 8) {
        if (local_9638 == 0) {
          local_6f8 = CONCAT44(iStack_9a44,local_9a48);
          uStack_6f0 = CONCAT44(iStack_9a3c,iStack_9a40);
          auVar39._8_8_ = uStack_6f0;
          auVar39._0_8_ = local_6f8;
          auVar38._8_8_ = uStack_6f0;
          auVar38._0_8_ = local_6f8;
          local_9ab8 = packusdw(auVar39,auVar38);
          local_540 = (undefined8 *)(local_9620 + (long)(local_9630 * local_9624 + local_9634) * 2);
          local_558 = local_9ab8._0_8_;
          uStack_550 = local_9ab8._8_8_;
          *local_540 = local_9ab8._0_8_;
          local_6e8 = local_6f8;
          uStack_6e0 = uStack_6f0;
        }
        else {
          local_5e0 = (ulong *)(local_9620 + (long)(local_9630 * local_9624 + local_9634) * 2);
          local_9a58 = *local_5e0;
          uStack_5f0 = 0;
          uStack_9a50 = 0;
          local_f8._8_8_ = 0;
          local_f8._0_8_ = local_9a58;
          local_9a68 = (__m128i)pmovzxwd(local_f8,local_9a58);
          local_5f8 = local_9a58;
          highbd_comp_avg_sse4_1
                    (&local_9a68,(__m128i *)&local_9a48,(__m128i *)&local_9668,
                     (__m128i *)&local_9678,local_963c);
          highbd_convolve_rounding_sse2
                    (&local_9a78,(__m128i *)&local_9698,(__m128i *)&local_96b8,local_969c);
          auVar41._8_8_ = extraout_XMM0_Qb;
          auVar41._0_8_ = extraout_XMM0_Qa;
          auVar40._8_8_ = extraout_XMM0_Qb;
          auVar40._0_8_ = extraout_XMM0_Qa;
          local_9a98 = packusdw(auVar41,auVar40);
          local_688 = local_9a98._0_8_;
          uVar18 = local_688;
          uStack_680 = local_9a98._8_8_;
          uVar19 = uStack_680;
          local_698 = local_96c8;
          uStack_690 = uStack_96c0;
          local_688._0_2_ = local_9a98._0_2_;
          local_688._2_2_ = local_9a98._2_2_;
          local_688._4_2_ = local_9a98._4_2_;
          local_688._6_2_ = local_9a98._6_2_;
          uStack_680._0_2_ = local_9a98._8_2_;
          uStack_680._2_2_ = local_9a98._10_2_;
          uStack_680._4_2_ = local_9a98._12_2_;
          uStack_680._6_2_ = local_9a98._14_2_;
          sVar8 = (short)local_96c8;
          local_9aa8 = (ushort)(sVar8 < (short)local_688) * sVar8 |
                       (ushort)(sVar8 >= (short)local_688) * (short)local_688;
          sVar8 = (short)((ulong)local_96c8 >> 0x10);
          uStack_9aa6 = (ushort)(sVar8 < local_688._2_2_) * sVar8 |
                        (ushort)(sVar8 >= local_688._2_2_) * local_688._2_2_;
          sVar8 = (short)((ulong)local_96c8 >> 0x20);
          uStack_9aa4 = (ushort)(sVar8 < local_688._4_2_) * sVar8 |
                        (ushort)(sVar8 >= local_688._4_2_) * local_688._4_2_;
          sVar8 = (short)((ulong)local_96c8 >> 0x30);
          uStack_9aa2 = (ushort)(sVar8 < local_688._6_2_) * sVar8 |
                        (ushort)(sVar8 >= local_688._6_2_) * local_688._6_2_;
          sVar8 = (short)uStack_96c0;
          uStack_9aa0 = (ushort)(sVar8 < (short)uStack_680) * sVar8 |
                        (ushort)(sVar8 >= (short)uStack_680) * (short)uStack_680;
          sVar8 = (short)((ulong)uStack_96c0 >> 0x10);
          uStack_9a9e = (ushort)(sVar8 < uStack_680._2_2_) * sVar8 |
                        (ushort)(sVar8 >= uStack_680._2_2_) * uStack_680._2_2_;
          sVar8 = (short)((ulong)uStack_96c0 >> 0x20);
          uStack_9a9c = (ushort)(sVar8 < uStack_680._4_2_) * sVar8 |
                        (ushort)(sVar8 >= uStack_680._4_2_) * uStack_680._4_2_;
          sVar8 = (short)((ulong)uStack_96c0 >> 0x30);
          uStack_9a9a = (ushort)(sVar8 < uStack_680._6_2_) * sVar8 |
                        (ushort)(sVar8 >= uStack_680._6_2_) * uStack_680._6_2_;
          local_520 = (undefined8 *)(local_b00 + (long)(local_9630 * local_b04 + local_9634) * 2);
          local_538 = CONCAT26(uStack_9aa2,CONCAT24(uStack_9aa4,CONCAT22(uStack_9aa6,local_9aa8)));
          uStack_530 = CONCAT26(uStack_9a9a,CONCAT24(uStack_9a9c,CONCAT22(uStack_9a9e,uStack_9aa0)))
          ;
          *local_520 = local_538;
          local_688 = uVar18;
          uStack_680 = uVar19;
        }
      }
      else {
        local_948 = CONCAT44(iStack_9a24,local_9a28);
        uStack_940 = CONCAT44(iStack_9a1c,iStack_9a20);
        local_958 = local_98c8;
        uStack_950 = uStack_98c0;
        local_1c8 = local_9a28 + (int)local_918;
        iStack_1c4 = iStack_9a24 + local_918._4_4_;
        iStack_1c0 = iStack_9a20 + (int)uStack_910;
        iStack_1bc = iStack_9a1c + uStack_910._4_4_;
        local_1d8 = local_98d8;
        uStack_1d0 = uStack_98d0;
        auVar67._8_8_ = uStack_98d0;
        auVar67._0_8_ = local_98d8;
        local_9ac8 = local_1c8 >> auVar67;
        iStack_9ac4 = iStack_1c4 >> auVar67;
        iStack_9ac0 = iStack_1c0 >> auVar67;
        iStack_9abc = iStack_1bc >> auVar67;
        local_968 = CONCAT44(iStack_9ac4,local_9ac8);
        uStack_960 = CONCAT44(iStack_9abc,iStack_9ac0);
        local_978 = local_9698;
        lStack_970 = lStack_9690;
        local_9ad8 = local_9ac8 + (int)local_938;
        iStack_9ad4 = iStack_9ac4 + local_938._4_4_;
        iStack_9ad0 = iStack_9ac0 + (int)uStack_930;
        iStack_9acc = iStack_9abc + uStack_930._4_4_;
        if (local_9638 == 0) {
          local_728 = CONCAT44(iStack_9a44,local_9a48);
          uStack_720 = CONCAT44(iStack_9a3c,iStack_9a40);
          local_738 = CONCAT44(iStack_9ad4,local_9ad8);
          uStack_730 = CONCAT44(iStack_9acc,iStack_9ad0);
          auVar35._8_8_ = uStack_720;
          auVar35._0_8_ = local_728;
          auVar34._8_8_ = uStack_730;
          auVar34._0_8_ = local_738;
          auVar94 = packusdw(auVar35,auVar34);
          local_660 = (undefined8 *)(local_9620 + (long)(local_9630 * local_9624 + local_9634) * 2);
          local_9b88 = auVar94._0_8_;
          uStack_9b80 = auVar94._8_8_;
          local_678 = local_9b88;
          uStack_670 = uStack_9b80;
          *local_660 = local_9b88;
          local_660[1] = uStack_9b80;
        }
        else {
          local_600 = (ulong *)(local_9620 + (long)(local_9630 * local_9624 + local_9634) * 2);
          local_9ae8 = *local_600;
          uStack_610 = 0;
          uStack_9ae0 = 0;
          local_620 = (ulong *)(local_9620 + 8 + (long)(local_9630 * local_9624 + local_9634) * 2);
          local_9af8 = *local_620;
          uStack_630 = 0;
          uStack_9af0 = 0;
          local_108._8_8_ = 0;
          local_108._0_8_ = local_9ae8;
          local_9b08 = (__m128i)pmovzxwd(local_108,local_9ae8);
          local_118._8_8_ = 0;
          local_118._0_8_ = local_9af8;
          local_9b18 = (__m128i)pmovzxwd(local_118,local_9af8);
          local_638 = local_9af8;
          local_618 = local_9ae8;
          highbd_comp_avg_sse4_1
                    (&local_9b08,(__m128i *)&local_9a48,(__m128i *)&local_9668,
                     (__m128i *)&local_9678,local_963c);
          highbd_comp_avg_sse4_1
                    (&local_9b18,(__m128i *)&local_9ad8,(__m128i *)&local_9668,
                     (__m128i *)&local_9678,local_963c);
          highbd_convolve_rounding_sse2
                    (&local_9b28,(__m128i *)&local_9698,(__m128i *)&local_96b8,local_969c);
          highbd_convolve_rounding_sse2
                    (&local_9b38,(__m128i *)&local_9698,(__m128i *)&local_96b8,local_969c);
          auVar37._8_8_ = extraout_XMM0_Qb_00;
          auVar37._0_8_ = extraout_XMM0_Qa_00;
          auVar36._8_8_ = extraout_XMM0_Qb_01;
          auVar36._0_8_ = extraout_XMM0_Qa_01;
          auVar94 = packusdw(auVar37,auVar36);
          local_9b68 = auVar94._0_8_;
          uStack_9b60 = auVar94._8_8_;
          local_6a8 = local_9b68;
          uVar18 = local_6a8;
          uStack_6a0 = uStack_9b60;
          uVar19 = uStack_6a0;
          local_6b8 = local_96c8;
          uStack_6b0 = uStack_96c0;
          local_6a8._0_2_ = auVar94._0_2_;
          local_6a8._2_2_ = auVar94._2_2_;
          local_6a8._4_2_ = auVar94._4_2_;
          local_6a8._6_2_ = auVar94._6_2_;
          uStack_6a0._0_2_ = auVar94._8_2_;
          uStack_6a0._2_2_ = auVar94._10_2_;
          uStack_6a0._4_2_ = auVar94._12_2_;
          uStack_6a0._6_2_ = auVar94._14_2_;
          sVar8 = (short)local_96c8;
          sVar9 = (short)((ulong)local_96c8 >> 0x10);
          sVar10 = (short)((ulong)local_96c8 >> 0x20);
          sVar11 = (short)((ulong)local_96c8 >> 0x30);
          sVar12 = (short)uStack_96c0;
          sVar13 = (short)((ulong)uStack_96c0 >> 0x10);
          sVar14 = (short)((ulong)uStack_96c0 >> 0x20);
          sVar15 = (short)((ulong)uStack_96c0 >> 0x30);
          local_640 = (undefined8 *)(local_b00 + (long)(local_9630 * local_b04 + local_9634) * 2);
          local_658 = CONCAT26((ushort)(sVar11 < local_6a8._6_2_) * sVar11 |
                               (ushort)(sVar11 >= local_6a8._6_2_) * local_6a8._6_2_,
                               CONCAT24((ushort)(sVar10 < local_6a8._4_2_) * sVar10 |
                                        (ushort)(sVar10 >= local_6a8._4_2_) * local_6a8._4_2_,
                                        CONCAT22((ushort)(sVar9 < local_6a8._2_2_) * sVar9 |
                                                 (ushort)(sVar9 >= local_6a8._2_2_) *
                                                 local_6a8._2_2_,
                                                 (ushort)(sVar8 < (short)local_6a8) * sVar8 |
                                                 (ushort)(sVar8 >= (short)local_6a8) *
                                                 (short)local_6a8)));
          uStack_650 = CONCAT26((ushort)(sVar15 < uStack_6a0._6_2_) * sVar15 |
                                (ushort)(sVar15 >= uStack_6a0._6_2_) * uStack_6a0._6_2_,
                                CONCAT24((ushort)(sVar14 < uStack_6a0._4_2_) * sVar14 |
                                         (ushort)(sVar14 >= uStack_6a0._4_2_) * uStack_6a0._4_2_,
                                         CONCAT22((ushort)(sVar13 < uStack_6a0._2_2_) * sVar13 |
                                                  (ushort)(sVar13 >= uStack_6a0._2_2_) *
                                                  uStack_6a0._2_2_,
                                                  (ushort)(sVar12 < (short)uStack_6a0) * sVar12 |
                                                  (ushort)(sVar12 >= (short)uStack_6a0) *
                                                  (short)uStack_6a0)));
          *local_640 = local_658;
          local_640[1] = uStack_650;
          local_6a8 = uVar18;
          uStack_6a0 = uVar19;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);

        const __m128i res_unsigned_lo =
            _mm_add_epi32(res_lo_round, offset_const);

        if (w < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));

            const __m128i data_ref_0 = _mm_cvtepu16_epi32(data_0);

            const __m128i comp_avg_res =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result = highbd_convolve_rounding_sse2(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result, round_result);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        } else {
          const __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_hi_round, offset_const);

          if (do_average) {
            const __m128i data_lo =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_hi =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j + 4]));

            const __m128i data_ref_0_lo = _mm_cvtepu16_epi32(data_lo);
            const __m128i data_ref_0_hi = _mm_cvtepu16_epi32(data_hi);

            const __m128i comp_avg_res_lo =
                highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi =
                highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result_lo, round_result_hi);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        }
      }
    }
  }
}